

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

int __thiscall
MutableS2ShapeIndex::Add
          (MutableS2ShapeIndex *this,unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *shape)

{
  size_type sVar1;
  pointer pSVar2;
  int id;
  unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *shape_local;
  MutableS2ShapeIndex *this_local;
  
  sVar1 = std::
          vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
          ::size(&this->shapes_);
  pSVar2 = std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>::operator->(shape);
  pSVar2->id_ = (int)sVar1;
  std::
  vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ::push_back(&this->shapes_,shape);
  std::atomic<MutableS2ShapeIndex::IndexStatus>::store
            (&this->index_status_,STALE,memory_order_relaxed);
  return (int)sVar1;
}

Assistant:

int MutableS2ShapeIndex::Add(unique_ptr<S2Shape> shape) {
  // Additions are processed lazily by ApplyUpdates().
  const int id = shapes_.size();
  shape->id_ = id;
  shapes_.push_back(std::move(shape));
  index_status_.store(STALE, std::memory_order_relaxed);
  return id;
}